

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O1

void __thiscall gms_matcher::SetScale(gms_matcher *this,int Scale)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long *local_178 [2];
  Mat local_168 [96];
  Mat local_108 [96];
  Mat local_a8 [144];
  
  dVar1 = mScaleRatios[Scale];
  iVar2 = (int)((double)(this->mGridSizeLeft).width * dVar1);
  (this->mGridSizeRight).width = iVar2;
  iVar3 = (int)((double)(this->mGridSizeLeft).height * dVar1);
  (this->mGridSizeRight).height = iVar3;
  iVar3 = iVar3 * iVar2;
  this->mGridNumberRight = iVar3;
  cv::Mat::zeros((int)local_178,iVar3,9);
  (**(code **)(*local_178[0] + 0x18))(local_178[0],local_178,&this->mGridNeighborRight,0xffffffff);
  cv::Mat::~Mat(local_a8);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat(local_168);
  InitalizeNiehbors(this,&this->mGridNeighborRight,&this->mGridSizeRight);
  return;
}

Assistant:

void SetScale(int Scale) {
		// Set Scale
		mGridSizeRight.width = mGridSizeLeft.width  * mScaleRatios[Scale];
		mGridSizeRight.height = mGridSizeLeft.height * mScaleRatios[Scale];
		mGridNumberRight = mGridSizeRight.width * mGridSizeRight.height;

		// Initialize the neihbor of right grid 
		mGridNeighborRight = Mat::zeros(mGridNumberRight, 9, CV_32SC1);
		InitalizeNiehbors(mGridNeighborRight, mGridSizeRight);
	}